

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matd.c
# Opt level: O0

void matd_add_inplace(matd_t *a,matd_t *b)

{
  int iVar1;
  ulong uVar2;
  uint local_20;
  uint local_1c;
  int j;
  int i;
  matd_t *b_local;
  matd_t *a_local;
  
  if (a == (matd_t *)0x0) {
    __assert_fail("a != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x139,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  if (b == (matd_t *)0x0) {
    __assert_fail("b != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x13a,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  if (a->nrows != b->nrows) {
    __assert_fail("a->nrows == b->nrows",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                  ,0x13b,"void matd_add_inplace(matd_t *, const matd_t *)");
  }
  if (a->ncols == b->ncols) {
    iVar1 = matd_is_scalar(a);
    if (iVar1 == 0) {
      for (local_1c = 0; local_1c < a->nrows; local_1c = local_1c + 1) {
        for (local_20 = 0; local_20 < a->ncols; local_20 = local_20 + 1) {
          uVar2 = (ulong)(local_1c * a->ncols + local_20);
          a[uVar2 + 1] = (matd_t)((double)b[(ulong)(local_1c * b->ncols + local_20) + 1] +
                                 (double)a[uVar2 + 1]);
        }
      }
    }
    else {
      a[1] = (matd_t)((double)b[1] + (double)a[1]);
    }
    return;
  }
  __assert_fail("a->ncols == b->ncols",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/matd.c"
                ,0x13c,"void matd_add_inplace(matd_t *, const matd_t *)");
}

Assistant:

void matd_add_inplace(matd_t *a, const matd_t *b)
{
    assert(a != NULL);
    assert(b != NULL);
    assert(a->nrows == b->nrows);
    assert(a->ncols == b->ncols);

    if (matd_is_scalar(a)) {
        a->data[0] += b->data[0];
        return;
    }

    for (int i = 0; i < a->nrows; i++) {
        for (int j = 0; j < a->ncols; j++) {
            MATD_EL(a, i, j) += MATD_EL(b, i, j);
        }
    }
}